

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8d_vdpu1.c
# Opt level: O2

MPP_RET hal_vp8d_vdpu1_wait(void *hal,HalTaskInfo *task)

{
  MPP_RET MVar1;
  
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"enter\n",0x2aa,
               "hal_vp8d_vdpu1_wait");
  }
  MVar1 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0x10,(void *)0x0);
  if (MVar1 != MPP_OK) {
    _mpp_log_l(2,"hal_vp8d_vdpu1","poll cmd failed %d\n","hal_vp8d_vdpu1_wait",(ulong)(uint)MVar1);
  }
  if (((byte)hal_vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"hal_vp8d_vdpu1","%s: line(%d), func(%s)",(char *)0x0,"leave\n",0x2b1,
               "hal_vp8d_vdpu1_wait");
  }
  return MVar1;
}

Assistant:

MPP_RET hal_vp8d_vdpu1_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    VP8DHalContext_t *ctx = (VP8DHalContext_t *)hal;

    FUN_T("enter\n");

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    (void)task;
    FUN_T("leave\n");
    return ret;
}